

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseBreakStmt(Parser *this)

{
  int iVar1;
  undefined8 *puVar2;
  CompileContext *pCVar3;
  long in_RSI;
  Token keyword;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined4 local_68;
  undefined2 local_64;
  undefined4 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined4 local_38;
  undefined2 local_34;
  
  local_60 = *(undefined4 *)(in_RSI + 0xb0);
  local_58[0] = &local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,*(long *)(in_RSI + 0xb8),
             *(long *)(in_RSI + 0xc0) + *(long *)(in_RSI + 0xb8));
  local_34 = *(undefined2 *)(in_RSI + 0xdc);
  local_38 = *(undefined4 *)(in_RSI + 0xd8);
  iVar1 = *(int *)(in_RSI + 0xe0);
  if (iVar1 == 0x10) {
    puVar2 = (undefined8 *)operator_new(0x38);
    local_90._0_4_ = iVar1;
    local_88._M_p = (pointer)&local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,*(long *)(in_RSI + 0xe8),
               *(long *)(in_RSI + 0xf0) + *(long *)(in_RSI + 0xe8));
    local_64 = *(undefined2 *)(in_RSI + 0x10c);
    local_68 = *(undefined4 *)(in_RSI + 0x108);
    *puVar2 = &PTR__UnitExpr_00128f88;
    *(undefined4 *)(puVar2 + 1) = local_90._0_4_;
    puVar2[2] = puVar2 + 4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p == &local_78) {
      puVar2[4] = local_78._M_allocated_capacity;
      puVar2[5] = local_78._8_8_;
    }
    else {
      puVar2[2] = local_88._M_p;
      puVar2[4] = local_78._M_allocated_capacity;
    }
    puVar2[3] = local_80;
    local_80 = 0;
    local_78._M_allocated_capacity = local_78._M_allocated_capacity & 0xffffffffffffff00;
    *(undefined2 *)((long)puVar2 + 0x34) = *(undefined2 *)(in_RSI + 0x10c);
    *(undefined4 *)(puVar2 + 6) = *(undefined4 *)(in_RSI + 0x108);
    local_88._M_p = (pointer)&local_78;
  }
  else {
    parseExpr((Parser *)local_90);
    puVar2 = (undefined8 *)CONCAT44(local_90._4_4_,local_90._0_4_);
  }
  pCVar3 = (CompileContext *)operator_new(0x40);
  if (local_58[0] == &local_48) {
    local_78._8_8_ = local_48._8_8_;
    local_88._M_p = (pointer)&local_78;
  }
  else {
    local_88._M_p = (pointer)local_58[0];
  }
  local_78._M_allocated_capacity._1_7_ = local_48._M_allocated_capacity._1_7_;
  local_78._M_local_buf[0] = local_48._M_local_buf[0];
  (pCVar3->m_source)._M_dataplus._M_p = (pointer)&PTR__BreakStmt_00129230;
  *(undefined4 *)&(pCVar3->m_source)._M_string_length = local_60;
  (pCVar3->m_source).field_2._M_allocated_capacity = (size_type)&pCVar3->m_options;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p == &local_78) {
    (pCVar3->m_options).m_filename._M_dataplus._M_p = (pointer)local_78._M_allocated_capacity;
    (pCVar3->m_options).m_filename._M_string_length = local_78._8_8_;
  }
  else {
    (pCVar3->m_source).field_2._M_allocated_capacity = (size_type)local_88._M_p;
    (pCVar3->m_options).m_filename._M_dataplus._M_p = (pointer)local_78._M_allocated_capacity;
  }
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&(pCVar3->m_source).field_2 + 8) = local_58[1];
  *(undefined2 *)((long)&(pCVar3->m_options).m_filename.field_2 + 4) = local_34;
  *(undefined4 *)&(pCVar3->m_options).m_filename.field_2 = local_38;
  *(undefined8 **)((long)&(pCVar3->m_options).m_filename.field_2 + 8) = puVar2;
  this->m_context = pCVar3;
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseBreakStmt() {
        Token keyword = m_previous;
        std::unique_ptr<Expr> value;
        if (check(TokenType::SEMICOLON)) {
            value = std::make_unique<UnitExpr>(m_current);
        } else {
            value = parseExpr();
        }

        return std::make_unique<BreakStmt>(std::move(keyword), std::move(value));
    }